

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

Reference __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MakeCommonExpr
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int index)

{
  Reference RVar1;
  
  RVar1 = BasicExprFactory<std::allocator<char>_>::MakeReference
                    (&this->super_ExprFactory,COMMON_EXPR,index);
  return (Reference)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
  ;
}

Assistant:

auto MakeCommonExpr(int index) {
    MP_ASSERT__RAISE(common_expr(index).is_known(),
                     fmt::format(
                         "Defined variable {} not provided in the input.\n"
                         "Please contact AMPL support.",
                         index));
    return ExprFactory::MakeCommonExpr(index);
  }